

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::MergeFrom
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *from)

{
  bool bVar1;
  NeuralNetworkMultiArrayShapeMapping NVar2;
  NeuralNetworkImageShapeMapping NVar3;
  ClassLabelsCase CVar4;
  LogMessage *other;
  ulong uVar5;
  NeuralNetworkClassifier *pNVar6;
  Arena *pAVar7;
  NetworkUpdateParameters *this_00;
  NetworkUpdateParameters *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  NeuralNetworkClassifier *local_28;
  NeuralNetworkClassifier *from_local;
  NeuralNetworkClassifier *this_local;
  NeuralNetworkClassifier *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe20f);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::MergeFrom
            (&this->layers_,&local_28->layers_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::MergeFrom
            (&this->preprocessing_,&local_28->preprocessing_);
  _internal_labelprobabilitylayername_abi_cxx11_(local_28);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pNVar6 = (NeuralNetworkClassifier *)_internal_labelprobabilitylayername_abi_cxx11_(local_28);
    this_local = pNVar6;
    local_10 = this;
    pAVar7 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->labelprobabilitylayername_,pNVar6,pAVar7)
    ;
  }
  bVar1 = _internal_has_updateparams(local_28);
  if (bVar1) {
    this_00 = _internal_mutable_updateparams(this);
    from_00 = _internal_updateparams(local_28);
    NetworkUpdateParameters::MergeFrom(this_00,from_00);
  }
  NVar2 = _internal_arrayinputshapemapping(local_28);
  if (NVar2 != RANK5_ARRAY_MAPPING) {
    NVar2 = _internal_arrayinputshapemapping(local_28);
    _internal_set_arrayinputshapemapping(this,NVar2);
  }
  NVar3 = _internal_imageinputshapemapping(local_28);
  if (NVar3 != RANK5_IMAGE_MAPPING) {
    NVar3 = _internal_imageinputshapemapping(local_28);
    _internal_set_imageinputshapemapping(this,NVar3);
  }
  CVar4 = ClassLabels_case(local_28);
  if (CVar4 != CLASSLABELS_NOT_SET) {
    if (CVar4 == kStringClassLabels) {
      this_01 = _internal_mutable_stringclasslabels(this);
      from_01 = _internal_stringclasslabels(local_28);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar4 == kInt64ClassLabels) {
      this_02 = _internal_mutable_int64classlabels(this);
      from_02 = _internal_int64classlabels(local_28);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NeuralNetworkClassifier::MergeFrom(const NeuralNetworkClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (!from._internal_labelprobabilitylayername().empty()) {
    _internal_set_labelprobabilitylayername(from._internal_labelprobabilitylayername());
  }
  if (from._internal_has_updateparams()) {
    _internal_mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from._internal_updateparams());
  }
  if (from._internal_arrayinputshapemapping() != 0) {
    _internal_set_arrayinputshapemapping(from._internal_arrayinputshapemapping());
  }
  if (from._internal_imageinputshapemapping() != 0) {
    _internal_set_imageinputshapemapping(from._internal_imageinputshapemapping());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}